

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O2

int open_set_channel_max(OPEN_HANDLE open,uint16_t channel_max_value)

{
  int iVar1;
  AMQP_VALUE item_value;
  int iVar2;
  OPEN_INSTANCE *open_instance;
  
  if (open == (OPEN_HANDLE)0x0) {
    iVar2 = 0x595;
  }
  else {
    item_value = amqpvalue_create_ushort(channel_max_value);
    if (item_value == (AMQP_VALUE)0x0) {
      iVar2 = 0x59d;
    }
    else {
      iVar1 = amqpvalue_set_composite_item(open->composite_value,3,item_value);
      iVar2 = 0x5a3;
      if (iVar1 == 0) {
        iVar2 = 0;
      }
      amqpvalue_destroy(item_value);
    }
  }
  return iVar2;
}

Assistant:

int open_set_channel_max(OPEN_HANDLE open, uint16_t channel_max_value)
{
    int result;

    if (open == NULL)
    {
        result = MU_FAILURE;
    }
    else
    {
        OPEN_INSTANCE* open_instance = (OPEN_INSTANCE*)open;
        AMQP_VALUE channel_max_amqp_value = amqpvalue_create_ushort(channel_max_value);
        if (channel_max_amqp_value == NULL)
        {
            result = MU_FAILURE;
        }
        else
        {
            if (amqpvalue_set_composite_item(open_instance->composite_value, 3, channel_max_amqp_value) != 0)
            {
                result = MU_FAILURE;
            }
            else
            {
                result = 0;
            }

            amqpvalue_destroy(channel_max_amqp_value);
        }
    }

    return result;
}